

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall FTypeTable::AddType(FTypeTable *this,PType *type)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar3;
  PType *pPVar4;
  uint uVar5;
  intptr_t parm2;
  intptr_t parm1;
  intptr_t local_40;
  intptr_t local_38;
  PClass *pPVar2;
  
  pPVar2 = (type->super_PTypeBase).super_DObject.Class;
  if (pPVar2 == (PClass *)0x0) {
    iVar1 = (**(type->super_PTypeBase).super_DObject._vptr_DObject)(type);
    pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
    (type->super_PTypeBase).super_DObject.Class = pPVar2;
  }
  pPVar2 = *(PClass **)
            &pPVar2[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject;
  (*(type->super_PTypeBase).super_DObject._vptr_DObject[0x14])(type,&local_38,&local_40);
  sVar3 = Hash(pPVar2,local_38,local_40);
  pPVar4 = FindType(this,pPVar2,local_38,local_40,(size_t *)0x0);
  if (pPVar4 == (PType *)0x0) {
    uVar5 = (int)sVar3 + (int)(sVar3 / 0x3fd) * -0x3fd;
    type->HashNext = this->TypeHash[uVar5];
    this->TypeHash[uVar5] = type;
    if ((GC::State == 1) && (((type->super_PTypeBase).super_DObject.ObjectFlags & 3) != 0)) {
      GC::Barrier((DObject *)0x0,(DObject *)type);
    }
    return;
  }
  __assert_fail("FindType(metatype, parm1, parm2, NULL) == NULL && \"Type must not be inserted more than once\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                ,0xe3e,"void FTypeTable::AddType(PType *)");
}

Assistant:

void FTypeTable::AddType(PType *type)
{
	PClass *metatype;
	intptr_t parm1, parm2;
	size_t bucket;

	metatype = type->GetClass()->TypeTableType;
	type->GetTypeIDs(parm1, parm2);
	bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	assert(FindType(metatype, parm1, parm2, NULL) == NULL && "Type must not be inserted more than once");

	type->HashNext = TypeHash[bucket];
	TypeHash[bucket] = type;
	GC::WriteBarrier(type);
}